

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_check_(int cond,char *file,int line,char *fmt,...)

{
  char in_AL;
  int level;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  char *local_60;
  char *lastsep;
  va_list args;
  int local_38;
  int local_34;
  int verbose_level;
  int result_color;
  char *result_str;
  char *fmt_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  int cond_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (cond == 0) {
    if ((acutest_test_already_logged_ == 0) && (acutest_current_test_ != (acutest_test_ *)0x0)) {
      acutest_finish_test_line_(-1);
    }
    _verbose_level = "failed";
    local_34 = 2;
    local_38 = 2;
    acutest_test_failures_ = acutest_test_failures_ + 1;
    acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
  }
  else {
    _verbose_level = "ok";
    local_34 = 1;
    local_38 = 3;
  }
  if (local_38 <= acutest_verbose_level_) {
    if ((acutest_case_already_logged_ == 0) && (acutest_case_name_[0] != '\0')) {
      acutest_line_indent_(1);
      acutest_colored_printf_(3,"Case %s:\n",acutest_case_name_);
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
      acutest_case_already_logged_ = acutest_case_already_logged_ + 1;
    }
    level = 1;
    if (acutest_case_name_[0] != '\0') {
      level = 2;
    }
    acutest_line_indent_(level);
    if (file != (char *)0x0) {
      local_60 = strrchr(file,0x2f);
      pcStack_18 = file;
      if (local_60 != (char *)0x0) {
        pcStack_18 = local_60 + 1;
      }
      printf("%s:%d: Check ",pcStack_18,(ulong)(uint)line);
    }
    args[0].overflow_arg_area = local_118;
    args[0]._0_8_ = &stack0x00000008;
    lastsep._4_4_ = 0x30;
    lastsep._0_4_ = 0x20;
    vprintf(fmt,&lastsep);
    printf("... ");
    acutest_colored_printf_(local_34,"%s",_verbose_level);
    printf("\n");
    acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
  }
  acutest_cond_failed_ = (uint)(cond == 0);
  return (int)((cond == 0) == 0);
}

Assistant:

acutest_check_(int cond, const char* file, int line, const char* fmt, ...)
{
    const char *result_str;
    int result_color;
    int verbose_level;

    if(cond) {
        result_str = "ok";
        result_color = ACUTEST_COLOR_GREEN_;
        verbose_level = 3;
    } else {
        if(!acutest_test_already_logged_  &&  acutest_current_test_ != NULL)
            acutest_finish_test_line_(-1);

        result_str = "failed";
        result_color = ACUTEST_COLOR_RED_;
        verbose_level = 2;
        acutest_test_failures_++;
        acutest_test_already_logged_++;
    }

    if(acutest_verbose_level_ >= verbose_level) {
        va_list args;

        if(!acutest_case_already_logged_  &&  acutest_case_name_[0]) {
            acutest_line_indent_(1);
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Case %s:\n", acutest_case_name_);
            acutest_test_already_logged_++;
            acutest_case_already_logged_++;
        }

        acutest_line_indent_(acutest_case_name_[0] ? 2 : 1);
        if(file != NULL) {
#ifdef ACUTEST_WIN_
            const char* lastsep1 = strrchr(file, '\\');
            const char* lastsep2 = strrchr(file, '/');
            if(lastsep1 == NULL)
                lastsep1 = file-1;
            if(lastsep2 == NULL)
                lastsep2 = file-1;
            file = (lastsep1 > lastsep2 ? lastsep1 : lastsep2) + 1;
#else
            const char* lastsep = strrchr(file, '/');
            if(lastsep != NULL)
                file = lastsep+1;
#endif
            printf("%s:%d: Check ", file, line);
        }

        va_start(args, fmt);
        vprintf(fmt, args);
        va_end(args);

        printf("... ");
        acutest_colored_printf_(result_color, "%s", result_str);
        printf("\n");
        acutest_test_already_logged_++;
    }

    acutest_cond_failed_ = (cond == 0);
    return !acutest_cond_failed_;
}